

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void mg_send_dns_query(mg_connection *nc,char *name,int query_type)

{
  mg_connection *nc_00;
  int iVar1;
  mg_dns_message *msg;
  size_t nlen;
  uint16_t len;
  mg_connection *local_50;
  mbuf pkt;
  
  local_50 = nc;
  msg = (mg_dns_message *)calloc(1,0xc20);
  if (LL_DEBUG < s_cs_log_level) {
    fprintf(_stderr,"%-20s ","mg_send_dns_query");
    cs_log_printf("%s %d",name,(ulong)(uint)query_type);
  }
  mbuf_init(&pkt,0x40);
  mg_dns_tid = mg_dns_tid + 1;
  msg->transaction_id = (uint16_t)mg_dns_tid;
  msg->flags = 0x100;
  msg->num_questions = 1;
  mg_dns_insert_header(&pkt,0,msg);
  msg->questions[0].rtype = query_type;
  msg->questions[0].rclass = 1;
  msg->questions[0].kind = MG_DNS_QUESTION;
  nlen = strlen(name);
  iVar1 = mg_dns_encode_record(&pkt,msg->questions,name,nlen,(void *)0x0,0);
  nc_00 = local_50;
  if (iVar1 != -1) {
    if ((local_50->flags & 2) == 0) {
      len = (ushort)pkt.len << 8 | (ushort)pkt.len >> 8;
      mbuf_insert(&pkt,0,&len,2);
    }
    mg_send(nc_00,pkt.buf,(int)pkt.len);
    mbuf_free(&pkt);
  }
  free(msg);
  return;
}

Assistant:

void mg_send_dns_query(struct mg_connection *nc, const char *name,
                       int query_type) {
    struct mg_dns_message *msg =
            (struct mg_dns_message *) MG_CALLOC(1, sizeof(*msg));
    struct mbuf pkt;
    struct mg_dns_resource_record *rr = &msg->questions[0];

    DBG(("%s %d", name, query_type));

    mbuf_init(&pkt, 64 /* Start small, it'll grow as needed. */);

    msg->transaction_id = ++mg_dns_tid;
    msg->flags = 0x100;
    msg->num_questions = 1;

    mg_dns_insert_header(&pkt, 0, msg);

    rr->rtype = query_type;
    rr->rclass = 1; /* Class: inet */
    rr->kind = MG_DNS_QUESTION;

    if (mg_dns_encode_record(&pkt, rr, name, strlen(name), NULL, 0) == -1) {
        /* TODO(mkm): return an error code */
        goto cleanup; /* LCOV_EXCL_LINE */
    }

    /* TCP DNS requires messages to be prefixed with len */
    if (!(nc->flags & MG_F_UDP)) {
        uint16_t len = htons(pkt.len);
        mbuf_insert(&pkt, 0, &len, 2);
    }

    mg_send(nc, pkt.buf, pkt.len);
    mbuf_free(&pkt);

    cleanup:
    MG_FREE(msg);
}